

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O1

entry * __thiscall
cppcms::url_mapper::data::get_entry
          (data *this,string_key *key,size_t params_no,string_key *full_url)

{
  const_iterator cVar1;
  _Base_ptr *pp_Var2;
  runtime_error *prVar3;
  long *plVar4;
  _Base_ptr *pp_Var5;
  size_type *psVar6;
  _Base_ptr *pp_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  cVar1 = std::
          _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>,_std::_Select1st<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
          ::find(&(this->by_key)._M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->by_key)._M_t._M_impl.super__Rb_tree_header) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
    string_key::str_abi_cxx11_(&local_88,key);
    std::operator+(&local_68,"url_mapper: key `",&local_88);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_e8._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_e8._M_dataplus._M_p == psVar6) {
      local_e8.field_2._M_allocated_capacity = *psVar6;
      local_e8.field_2._8_8_ = plVar4[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar6;
    }
    local_e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    string_key::str_abi_cxx11_(&local_a8,full_url);
    std::operator+(&local_48,&local_e8,&local_a8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_c8._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_c8._M_dataplus._M_p == psVar6) {
      local_c8.field_2._M_allocated_capacity = *psVar6;
      local_c8.field_2._8_8_ = plVar4[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar6;
    }
    local_c8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    booster::runtime_error::runtime_error(prVar3,&local_c8);
    *(undefined ***)prVar3 = &PTR__runtime_error_00287810;
    (prVar3->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
    __cxa_throw(prVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  pp_Var2 = &cVar1._M_node[2]._M_right;
  pp_Var7 = pp_Var2;
  for (pp_Var5 = *(_Base_ptr **)(cVar1._M_node + 3); pp_Var5 != (_Base_ptr *)0x0;
      pp_Var5 = (_Base_ptr *)pp_Var5[(ulong)(pp_Var5[4] < params_no) + 2]) {
    if (pp_Var5[4] >= params_no) {
      pp_Var7 = pp_Var5;
    }
  }
  pp_Var5 = pp_Var2;
  if ((pp_Var7 != pp_Var2) && (pp_Var5 = pp_Var7, params_no < pp_Var7[4])) {
    pp_Var5 = pp_Var2;
  }
  if (pp_Var5 != pp_Var2) {
    return (entry *)(pp_Var5 + 5);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
  string_key::str_abi_cxx11_(&local_88,key);
  std::operator+(&local_68,"url_mapper: invalid number of parameters for ",&local_88);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar6) {
    local_e8.field_2._M_allocated_capacity = *psVar6;
    local_e8.field_2._8_8_ = plVar4[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar6;
  }
  local_e8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  string_key::str_abi_cxx11_(&local_a8,full_url);
  std::operator+(&local_48,&local_e8,&local_a8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_c8._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar6) {
    local_c8.field_2._M_allocated_capacity = *psVar6;
    local_c8.field_2._8_8_ = plVar4[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar6;
  }
  local_c8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  booster::runtime_error::runtime_error(prVar3,&local_c8);
  *(undefined ***)prVar3 = &PTR__runtime_error_00287810;
  (prVar3->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
  __cxa_throw(prVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

entry const &get_entry(string_key const &key,size_t params_no,string_key const &full_url) const
		{
			by_key_type::const_iterator kp = by_key.find(key);
			if(kp == by_key.end())
				throw cppcms_error("url_mapper: key `" + key.str() + "' not found for "
						"url `" + full_url.str() + "'");
			by_size_type::const_iterator sp = kp->second.find(params_no);
			if(sp == kp->second.end())
				throw cppcms_error("url_mapper: invalid number of parameters for " + key.str() +
						"in url `" + full_url.str() + "'");
			return sp->second;
		}